

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

pair<const_llvm::LoadInst_*,_const_llvm::Value_*>
dg::vr::getParams(ValueRelations *graph,ICmpInst *icmp)

{
  LoadInst *load_1;
  LoadInst *load;
  Value *op2;
  Value *op1;
  uint in_stack_ffffffffffffffac;
  V in_stack_ffffffffffffffb0;
  ValueRelations *in_stack_ffffffffffffffb8;
  LoadInst *local_40;
  LoadInst *local_38;
  Value *local_30;
  Value *local_28 [3];
  pair<const_llvm::LoadInst_*,_const_llvm::Value_*> local_10;
  
  local_28[0] = llvm::CmpInst::getOperand
                          ((CmpInst *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  local_30 = llvm::CmpInst::getOperand
                       ((CmpInst *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  local_38 = ValueRelations::getInstance<llvm::LoadInst>
                       (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (local_38 == (LoadInst *)0x0) {
    local_40 = ValueRelations::getInstance<llvm::LoadInst>
                         (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (local_40 == (LoadInst *)0x0) {
      std::pair<const_llvm::LoadInst_*,_const_llvm::Value_*>::
      pair<std::nullptr_t,_std::nullptr_t,_true>
                (&local_10,(void **)&stack0xffffffffffffffb8,(void **)&stack0xffffffffffffffb0);
    }
    else {
      std::pair<const_llvm::LoadInst_*,_const_llvm::Value_*>::
      pair<const_llvm::LoadInst_*&,_const_llvm::Value_*&,_true>(&local_10,&local_40,local_28);
    }
  }
  else {
    std::pair<const_llvm::LoadInst_*,_const_llvm::Value_*>::
    pair<const_llvm::LoadInst_*&,_const_llvm::Value_*&,_true>(&local_10,&local_38,&local_30);
  }
  return local_10;
}

Assistant:

std::pair<const llvm::LoadInst *, const llvm::Value *>
getParams(const ValueRelations &graph, const llvm::ICmpInst *icmp) {
    const llvm::Value *op1 = icmp->getOperand(0);
    const llvm::Value *op2 = icmp->getOperand(1);
    if (const auto *load = graph.getInstance<llvm::LoadInst>(op1))
        return {load, op2};
    if (const auto *load = graph.getInstance<llvm::LoadInst>(op2))
        return {load, op1};
    return {nullptr, nullptr};
}